

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cpp
# Opt level: O1

void __thiscall Edge::Edge(Edge *this,int id)

{
  this->id = id;
  this->nextEdge = (Edge *)0x0;
  this->origin = (Vertex *)0x0;
  *(undefined8 *)((long)&this->origin + 1) = 0;
  *(undefined8 *)((long)&this->destiny + 1) = 0;
  this->activePowerFlow = 0.0;
  this->reactivePowerFlow = 0.0;
  this->resistance = 0.0;
  this->reactance = 0.0;
  this->activeLoss = 0.0;
  this->reactiveLoss = 0.0;
  this->modifiable = true;
  this->marked = true;
  this->fixed = false;
  return;
}

Assistant:

Edge::Edge(int id){

    this->id = id;

    this->nextEdge          = NULL;
    this->origin            = NULL;
    this->destiny           = NULL;

    this->closed            = false;

    this->activePowerFlow   = 0.0;
    this->reactivePowerFlow = 0.0;
    this->resistance        = 0.0;
    this->reactance         = 0.0;
    this->activeLoss        = 0.0;
    this->reactiveLoss      = 0.0;

    this->modifiable = true;
    this->marked = true;
    this->fixed = false;
}